

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O3

bool __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::Case(ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
       *this)

{
  pointer puVar1;
  pointer puVar2;
  bool bVar3;
  eval_error *peVar4;
  _Alloc_hider _Var5;
  size_t t_match_start;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  Depth_Counter dc;
  string local_88;
  File_Position local_68;
  Depth_Counter local_60;
  string local_58;
  string local_38;
  
  Depth_Counter::Depth_Counter(&local_60,this);
  puVar1 = (this->m_match_stack).
           super__Vector_base<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar2 = (this->m_match_stack).
           super__Vector_base<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_88._M_dataplus._M_p = &DAT_00000004;
  local_88._M_string_length = 0x4d78bb;
  bVar3 = Keyword(this,(Static_String *)&local_88);
  t_match_start = (long)puVar1 - (long)puVar2 >> 3;
  if (bVar3) {
    bVar3 = Char(this,'(');
    if (!bVar3) {
      peVar4 = (eval_error *)__cxa_allocate_exception(0x90);
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,"Incomplete \'case\' expression","");
      local_68.line = (this->m_position).line;
      local_68.column = (this->m_position).col;
      exception::eval_error::eval_error
                (peVar4,&local_88,&local_68,
                 (this->m_filename).
                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
      __cxa_throw(peVar4,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
    }
    bVar3 = Operator(this,0);
    if (!bVar3) {
LAB_004aefc8:
      peVar4 = (eval_error *)__cxa_allocate_exception(0x90);
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,"Incomplete \'case\' expression","");
      local_68.line = (this->m_position).line;
      local_68.column = (this->m_position).col;
      exception::eval_error::eval_error
                (peVar4,&local_88,&local_68,
                 (this->m_filename).
                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
      __cxa_throw(peVar4,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
    }
    bVar3 = Char(this,')');
    if (!bVar3) goto LAB_004aefc8;
    do {
      bVar3 = Eol(this);
    } while (bVar3);
    bVar3 = Block(this);
    if (!bVar3) {
      peVar4 = (eval_error *)__cxa_allocate_exception(0x90);
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,"Incomplete \'case\' block","");
      local_68.line = (this->m_position).line;
      local_68.column = (this->m_position).col;
      exception::eval_error::eval_error
                (peVar4,&local_88,&local_68,
                 (this->m_filename).
                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
      __cxa_throw(peVar4,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
    }
    paVar6 = &local_38.field_2;
    local_38._M_dataplus._M_p = (pointer)paVar6;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"");
    ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
    ::build_match<chaiscript::eval::Case_AST_Node<chaiscript::eval::Tracer<Count_Tracer>>>
              ((ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
                *)this,t_match_start,&local_38);
    _Var5._M_p = local_38._M_dataplus._M_p;
  }
  else {
    local_88._M_dataplus._M_p = (pointer)0x7;
    local_88._M_string_length = 0x4e2ec5;
    bVar3 = Keyword(this,(Static_String *)&local_88);
    if (!bVar3) {
      bVar3 = false;
      goto LAB_004aefb5;
    }
    do {
      bVar3 = Eol(this);
    } while (bVar3);
    bVar3 = Block(this);
    if (!bVar3) {
      peVar4 = (eval_error *)__cxa_allocate_exception(0x90);
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,"Incomplete \'default\' block","");
      local_68.line = (this->m_position).line;
      local_68.column = (this->m_position).col;
      exception::eval_error::eval_error
                (peVar4,&local_88,&local_68,
                 (this->m_filename).
                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
      __cxa_throw(peVar4,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
    }
    paVar6 = &local_58.field_2;
    local_58._M_dataplus._M_p = (pointer)paVar6;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"");
    ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
    ::build_match<chaiscript::eval::Default_AST_Node<chaiscript::eval::Tracer<Count_Tracer>>>
              ((ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
                *)this,t_match_start,&local_58);
    _Var5._M_p = local_58._M_dataplus._M_p;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var5._M_p != paVar6) {
    operator_delete(_Var5._M_p,paVar6->_M_allocated_capacity + 1);
  }
  bVar3 = true;
LAB_004aefb5:
  (local_60.parser)->m_current_parse_depth = (local_60.parser)->m_current_parse_depth - 1;
  return bVar3;
}

Assistant:

bool Case() {
        Depth_Counter dc{this};
        bool retval = false;

        const auto prev_stack_top = m_match_stack.size();

        if (Keyword("case")) {
          retval = true;

          if (!Char('(')) {
            throw exception::eval_error("Incomplete 'case' expression", File_Position(m_position.line, m_position.col), *m_filename);
          }

          if (!(Operator() && Char(')'))) {
            throw exception::eval_error("Incomplete 'case' expression", File_Position(m_position.line, m_position.col), *m_filename);
          }

          while (Eol()) {
          }

          if (!Block()) {
            throw exception::eval_error("Incomplete 'case' block", File_Position(m_position.line, m_position.col), *m_filename);
          }

          build_match<eval::Case_AST_Node<Tracer>>(prev_stack_top);
        } else if (Keyword("default")) {
          retval = true;

          while (Eol()) {
          }

          if (!Block()) {
            throw exception::eval_error("Incomplete 'default' block", File_Position(m_position.line, m_position.col), *m_filename);
          }

          build_match<eval::Default_AST_Node<Tracer>>(prev_stack_top);
        }

        return retval;
      }